

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi-type-conversions.cpp
# Opt level: O3

int main(void)

{
  environment env;
  int argc;
  char **argv;
  undefined1 auStack_18 [4];
  undefined4 local_14;
  undefined8 local_10;
  
  local_14 = 0;
  local_10 = 0;
  MPI_Init_thread(&local_14,&local_10,1,auStack_18);
  TestConversions<ompi_communicator_t_*,_diy::mpi::communicator>::Run
            ((ompi_communicator_t *)&ompi_mpi_comm_world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main()
{
  diy::mpi::environment env;

  TestConversions<MPI_Comm, diy::mpi::communicator>::Run(MPI_COMM_WORLD);
  TestConversions<MPI_Datatype, diy::mpi::datatype>::Run();
  TestConversions<MPI_Op, diy::mpi::operation>::Run();
  TestConversions<MPI_Status, diy::mpi::status>::Run();

  // This test is expected to pass or fail during compilation
  return 0;
}